

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeSerialGet(uchar *buf,u32 serial_type,Mem *pMem)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  u16 uVar6;
  ulong uVar7;
  ulong uVar8;
  MemValue MVar9;
  
  switch(serial_type) {
  case 0:
  case 0xb:
    pMem->flags = 1;
    return;
  case 1:
    uVar7 = (ulong)(char)*buf;
    break;
  case 2:
    uVar7 = (long)(char)*buf << 8;
    bVar1 = buf[1];
    goto LAB_0014f4bd;
  case 3:
    uVar7 = (ulong)buf[2] | (ulong)buf[1] << 8 | (long)(char)*buf << 0x10;
    break;
  case 4:
    uVar7 = (ulong)buf[2] << 8 | (ulong)buf[1] << 0x10 | (long)(char)*buf << 0x18;
    bVar1 = buf[3];
LAB_0014f4bd:
    (pMem->u).i = bVar1 | uVar7;
    goto LAB_0014f4e7;
  case 5:
    uVar5 = *(uint *)(buf + 2);
    MVar9.i._4_4_ = (int)CONCAT11(*buf,buf[1]);
    MVar9.nZero = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    goto LAB_0014f47c;
  case 6:
  case 7:
    uVar5 = (uint)buf[1] << 0x10 | (uint)*buf << 0x18;
    bVar1 = buf[4];
    bVar2 = buf[5];
    bVar3 = buf[6];
    bVar4 = buf[7];
    uVar7 = (ulong)((ushort)(*(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8) | uVar5) << 0x20
    ;
    uVar8 = uVar7 | (ulong)bVar1 << 0x18 | (ulong)bVar2 << 0x10 | (ulong)bVar4 | (ulong)bVar3 << 8;
    if (serial_type == 6) {
      (pMem->u).i = uVar8;
      uVar6 = 4;
    }
    else {
      (pMem->u).i = uVar8;
      uVar6 = 1;
      if (((((uVar7 & 0xfffffffffffff) == 0 && (ulong)bVar1 == 0) && (ulong)bVar2 == 0) &&
          (ulong)bVar4 == 0) && (ulong)bVar3 == 0) {
        uVar6 = 8;
      }
      if ((~uVar5 & 0x7ff00000) != 0) {
        uVar6 = 8;
      }
    }
    pMem->flags = uVar6;
    return;
  case 8:
  case 9:
    MVar9.nZero = serial_type - 8;
    MVar9.i._4_4_ = 0;
LAB_0014f47c:
    pMem->u = MVar9;
    goto LAB_0014f4e7;
  case 10:
    pMem->flags = 0x401;
    pMem->n = 0;
    (pMem->u).nZero = 0;
    return;
  default:
    pMem->z = (char *)buf;
    pMem->n = serial_type - 0xc >> 1;
    pMem->flags = sqlite3VdbeSerialGet::aFlag[serial_type & 1];
    return;
  }
  (pMem->u).i = uVar7;
LAB_0014f4e7:
  pMem->flags = 4;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSerialGet(
  const unsigned char *buf,     /* Buffer to deserialize from */
  u32 serial_type,              /* Serial type to deserialize */
  Mem *pMem                     /* Memory cell to write value into */
){
  switch( serial_type ){
    case 10: { /* Internal use only: NULL with virtual table
               ** UPDATE no-change flag set */
      pMem->flags = MEM_Null|MEM_Zero;
      pMem->n = 0;
      pMem->u.nZero = 0;
      return;
    }
    case 11:   /* Reserved for future use */
    case 0: {  /* Null */
      /* EVIDENCE-OF: R-24078-09375 Value is a NULL. */
      pMem->flags = MEM_Null;
      return;
    }
    case 1: {
      /* EVIDENCE-OF: R-44885-25196 Value is an 8-bit twos-complement
      ** integer. */
      pMem->u.i = ONE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 2: { /* 2-byte signed integer */
      /* EVIDENCE-OF: R-49794-35026 Value is a big-endian 16-bit
      ** twos-complement integer. */
      pMem->u.i = TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 3: { /* 3-byte signed integer */
      /* EVIDENCE-OF: R-37839-54301 Value is a big-endian 24-bit
      ** twos-complement integer. */
      pMem->u.i = THREE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 4: { /* 4-byte signed integer */
      /* EVIDENCE-OF: R-01849-26079 Value is a big-endian 32-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_INT(buf);
#ifdef __HP_cc
      /* Work around a sign-extension bug in the HP compiler for HP/UX */
      if( buf[0]&0x80 ) pMem->u.i |= 0xffffffff80000000LL;
#endif
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 5: { /* 6-byte signed integer */
      /* EVIDENCE-OF: R-50385-09674 Value is a big-endian 48-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_UINT(buf+2) + (((i64)1)<<32)*TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 6:   /* 8-byte signed integer */
    case 7: { /* IEEE floating point */
      /* These use local variables, so do them in a separate routine
      ** to avoid having to move the frame pointer in the common case */
      serialGet(buf,serial_type,pMem);
      return;
    }
    case 8:    /* Integer 0 */
    case 9: {  /* Integer 1 */
      /* EVIDENCE-OF: R-12976-22893 Value is the integer 0. */
      /* EVIDENCE-OF: R-18143-12121 Value is the integer 1. */
      pMem->u.i = serial_type-8;
      pMem->flags = MEM_Int;
      return;
    }
    default: {
      /* EVIDENCE-OF: R-14606-31564 Value is a BLOB that is (N-12)/2 bytes in
      ** length.
      ** EVIDENCE-OF: R-28401-00140 Value is a string in the text encoding and
      ** (N-13)/2 bytes in length. */
      static const u16 aFlag[] = { MEM_Blob|MEM_Ephem, MEM_Str|MEM_Ephem };
      pMem->z = (char *)buf;
      pMem->n = (serial_type-12)/2;
      pMem->flags = aFlag[serial_type&1];
      return;
    }
  }
  return;
}